

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.cc
# Opt level: O0

void find_coreGLES2(void)

{
  int iVar1;
  size_t __n;
  size_t length;
  char *prefixes [4];
  char *version;
  int minor;
  int major;
  int i;
  bool local_41;
  char *local_38 [5];
  int local_c;
  int local_8;
  int local_4;
  
  local_38[0] = "OpenGL ES-CM ";
  local_38[1] = "OpenGL ES-CL ";
  local_38[2] = "OpenGL ES ";
  local_38[3] = (char *)0x0;
  local_38[4] = (char *)(*glad_glGetString)(0x1f02);
  if ((GLubyte *)local_38[4] != (GLubyte *)0x0) {
    for (local_4 = 0; local_38[local_4] != (char *)0x0; local_4 = local_4 + 1) {
      __n = strlen(local_38[local_4]);
      iVar1 = strncmp(local_38[4],local_38[local_4],__n);
      if (iVar1 == 0) {
        local_38[4] = local_38[4] + __n;
        break;
      }
    }
    __isoc99_sscanf(local_38[4],"%d.%d",&local_8,&local_c);
    GLVersion.major = local_8;
    GLVersion.minor = local_c;
    max_loaded_major = local_8;
    max_loaded_minor = local_c;
    if ((local_8 != 2) || (local_41 = true, local_c < 0)) {
      local_41 = 2 < local_8;
    }
    GLAD_GL_ES_VERSION_2_0 = (int)local_41;
    if ((2 < local_8) || ((1 < local_8 && (-1 < local_c)))) {
      max_loaded_major = 2;
      max_loaded_minor = 0;
    }
  }
  return;
}

Assistant:

static void find_coreGLES2(void) {

    /* Thank you @elmindreda
     * https://github.com/elmindreda/greg/blob/master/templates/greg.c.in#L176
     * https://github.com/glfw/glfw/blob/master/src/context.c#L36
     */
    int i, major, minor;

    const char* version;
    const char* prefixes[] = {
        "OpenGL ES-CM ",
        "OpenGL ES-CL ",
        "OpenGL ES ",
        NULL
    };

    version = (const char*) glGetString(GL_VERSION);
    if (!version) return;

    for (i = 0;  prefixes[i];  i++) {
        const size_t length = strlen(prefixes[i]);
        if (strncmp(version, prefixes[i], length) == 0) {
            version += length;
            break;
        }
    }

/* PR #18 */
#ifdef _MSC_VER
    sscanf_s(version, "%d.%d", &major, &minor);
#else
    sscanf(version, "%d.%d", &major, &minor);
#endif

    GLVersion.major = major; GLVersion.minor = minor;
    max_loaded_major = major; max_loaded_minor = minor;
	GLAD_GL_ES_VERSION_2_0 = (major == 2 && minor >= 0) || major > 2;
	if (GLVersion.major > 2 || (GLVersion.major >= 2 && GLVersion.minor >= 0)) {
		max_loaded_major = 2;
		max_loaded_minor = 0;
	}
}